

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HVectorBase.cpp
# Opt level: O0

void __thiscall HVectorBase<double>::clear(HVectorBase<double> *this)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  HVectorBase<double> *in_RDI;
  HighsInt i;
  HighsInt dense_clear;
  size_type in_stack_ffffffffffffffc8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffd0;
  vector<double,_std::allocator<double>_> *this_00;
  int local_1c;
  
  bVar1 = true;
  if (-1 < in_RDI->count) {
    bVar1 = (double)in_RDI->size * 0.3 < (double)in_RDI->count;
  }
  if (bVar1) {
    std::vector<double,_std::allocator<double>_>::assign
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(value_type_conflict1 *)0x7f687a)
    ;
  }
  else {
    for (local_1c = 0; local_1c < in_RDI->count; local_1c = local_1c + 1) {
      this_00 = &in_RDI->array;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->index,(long)local_1c);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)*pvVar2);
      *pvVar3 = 0.0;
    }
  }
  clearScalars(in_RDI);
  return;
}

Assistant:

void HVectorBase<Real>::clear() {
  /*
   * Clear an HVector instance
   */
  // Standard HVector to clear
  HighsInt dense_clear = count < 0 || count > size * 0.3;
  if (dense_clear) {
    // Treat the array as full if there are no indices or too many
    // indices
    array.assign(size, Real{0});
  } else {
    // Zero according to the indices of (possible) nonzeros
    for (HighsInt i = 0; i < count; i++) {
      array[index[i]] = 0;
    }
  }
  this->clearScalars();
}